

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crate-format.hh
# Opt level: O0

optional<bool> __thiscall tinyusdz::crate::CrateValue::get_value<bool>(CrateValue *this)

{
  bool in_SIL;
  optional<bool> local_1a [5];
  CrateValue *this_local;
  
  this_local = this;
  tinyusdz::value::Value::get_value<bool>((Value *)local_1a,in_SIL);
  nonstd::optional_lite::optional<bool>::optional<bool,_0>((optional<bool> *)this,local_1a);
  nonstd::optional_lite::optional<bool>::~optional(local_1a);
  return SUB82(this,0);
}

Assistant:

nonstd::optional<T> get_value() const {
    return value_.get_value<T>();
  }